

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpiabi_defn_functions_fortran.h
# Opt level: O0

void mpiabi_pack_(void *inbuf,MPIABI_Fint *incount,MPIABI_Fint *datatype,void *outbuf,
                 MPIABI_Fint *outsize,int *position,MPIABI_Fint *comm,MPIABI_Fint *ierror)

{
  int *position_local;
  MPIABI_Fint *outsize_local;
  void *outbuf_local;
  MPIABI_Fint *datatype_local;
  MPIABI_Fint *incount_local;
  void *inbuf_local;
  
  mpi_pack_(inbuf,incount,datatype,outbuf,outsize,position,comm,ierror);
  return;
}

Assistant:

void mpiabi_pack_(
  const void * inbuf,
  const MPIABI_Fint * incount,
  const MPIABI_Fint * datatype,
  void * outbuf,
  const MPIABI_Fint * outsize,
  int * position,
  const MPIABI_Fint * comm,
  MPIABI_Fint * ierror
) {
  return mpi_pack_(
    inbuf,
    incount,
    datatype,
    outbuf,
    outsize,
    position,
    comm,
    ierror
  );
}